

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<std::shared_ptr<henson::Puppet>,std::__cxx11::string,henson::ProcMap*,0ul,1ul>
               (undefined8 param_1,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_2,
               undefined8 param_3)

{
  bad_boxed_cast *anon_var_0;
  Type_Conversions_State *in_stack_00000090;
  Boxed_Value *in_stack_00000098;
  Type_Conversions_State *in_stack_000000a0;
  Boxed_Value *in_stack_000000a8;
  string local_48 [32];
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_18;
  undefined8 local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_2,0);
  boxed_cast<std::__cxx11::string>(in_stack_00000098,in_stack_00000090);
  local_28 = 0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (local_18,1);
  boxed_cast<henson::ProcMap*>(in_stack_000000a8,in_stack_000000a0);
  local_24 = 0;
  std::__cxx11::string::~string(local_48);
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }